

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDisallowedCommand.h
# Opt level: O2

void __thiscall cmDisallowedCommand::~cmDisallowedCommand(cmDisallowedCommand *this)

{
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmDisallowedCommand_00634cc8;
  if (this->Command != (cmCommand *)0x0) {
    (*this->Command->_vptr_cmCommand[1])();
  }
  cmCommand::~cmCommand(&this->super_cmCommand);
  return;
}

Assistant:

~cmDisallowedCommand() CM_OVERRIDE { delete this->Command; }